

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configManager.cpp
# Opt level: O2

void ConfigManager::storeFilter(ofstream *out,FilterSlicer *filter)

{
  pointer pPVar1;
  int i;
  ulong uVar2;
  long lVar3;
  uint32_t n;
  double y;
  double x;
  
  n = (uint32_t)
      ((ulong)((long)(filter->poly).
                     super__Vector_base<Geometry::Point,_std::allocator<Geometry::Point>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(filter->poly).
                    super__Vector_base<Geometry::Point,_std::allocator<Geometry::Point>_>._M_impl.
                    super__Vector_impl_data._M_start) >> 4);
  std::ostream::write((char *)out,(long)&n);
  lVar3 = 8;
  for (uVar2 = 0; uVar2 < n; uVar2 = uVar2 + 1) {
    pPVar1 = (filter->poly).super__Vector_base<Geometry::Point,_std::allocator<Geometry::Point>_>.
             _M_impl.super__Vector_impl_data._M_start;
    x = *(double *)((long)pPVar1 + lVar3 + -8);
    y = *(double *)((long)&pPVar1->x + lVar3);
    std::ostream::write((char *)out,(long)&x);
    std::ostream::write((char *)out,(long)&y);
    lVar3 = lVar3 + 0x10;
  }
  return;
}

Assistant:

void ConfigManager::storeFilter(std::ofstream &out, FilterSlicer* filter) {
	uint32_t n = filter->poly.size();
	out.write((char*)&n, sizeof(n));
	for(int i=0;i<n;++i)
	{
		double x,y;
		x = filter->poly[i].x;
		y = filter->poly[i].y;
		out.write((char*)&x, sizeof(x));
		out.write((char*)&y, sizeof(y));
	}
}